

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * fmt::v6::internal::
          parse_align<wchar_t,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  char cVar1;
  align_t align;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  bool bVar4;
  basic_string_view<wchar_t> fill;
  
  pwVar2 = begin + 1;
  pwVar3 = pwVar2;
  if (pwVar2 == end) {
    pwVar3 = begin;
  }
  do {
    cVar1 = (char)*pwVar3;
    if (cVar1 == '<') {
      align = left;
LAB_001652da:
      if ((long)pwVar3 - (long)begin != 0) {
        if (*begin == L'{') {
          specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          ::on_error(&handler->
                      super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                     ,"invalid fill character \'{\'");
          return begin;
        }
        fill.size_ = (long)pwVar3 - (long)begin >> 2;
        fill.data_ = begin;
        specs_setter<wchar_t>::on_fill((specs_setter<wchar_t> *)handler,fill);
        pwVar2 = pwVar3 + 1;
      }
      specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
      ::on_align(handler,align);
      return pwVar2;
    }
    if (cVar1 == '^') {
      align = center;
      goto LAB_001652da;
    }
    if (cVar1 == '>') {
      align = right;
      goto LAB_001652da;
    }
    if (cVar1 == '=') {
      align = numeric;
      goto LAB_001652da;
    }
    bVar4 = pwVar3 == begin;
    pwVar3 = begin;
    if (bVar4) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = next_code_point(begin, end);
  if (p == end) p = begin;
  for (;;) {
    switch (static_cast<char>(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}